

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

bool __thiscall IRBuilder::DoBailOnNoProfile(IRBuilder *this)

{
  bool bVar1;
  uint16 uVar2;
  uint sourceContextId;
  uint functionId;
  Func *pFVar3;
  JITTimeWorkItem *this_00;
  JITTimeProfileInfo *this_01;
  JITTimeFunctionBody *this_02;
  Func *topFunc;
  IRBuilder *this_local;
  
  pFVar3 = Func::GetTopFunc(this->m_func);
  sourceContextId = Func::GetSourceContextId(pFVar3);
  pFVar3 = Func::GetTopFunc(this->m_func);
  functionId = Func::GetLocalFunctionId(pFVar3);
  bVar1 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,BailOnNoProfilePhase,sourceContextId,functionId);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    pFVar3 = Func::GetTopFunc(this->m_func);
    this_00 = Func::GetWorkItem(pFVar3);
    uVar2 = JITTimeWorkItem::GetProfiledIterations(this_00);
    if (uVar2 == 0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = Func::HasProfileInfo(this->m_func);
      if (bVar1) {
        this_01 = Func::GetReadOnlyProfileInfo(this->m_func);
        bVar1 = JITTimeProfileInfo::IsNoProfileBailoutsDisabled(this_01);
        if (bVar1) {
          return false;
        }
      }
      bVar1 = Func::DoGlobOpt(this->m_func);
      if (bVar1) {
        pFVar3 = Func::GetTopFunc(this->m_func);
        if ((pFVar3 == this->m_func) ||
           (bVar1 = Js::ConfigFlagsTable::IsEnabled
                              ((ConfigFlagsTable *)&Js::Configuration::Global,ForceJITLoopBodyFlag),
           !bVar1)) {
          bVar1 = Func::HasProfileInfo(this->m_func);
          if (bVar1) {
            pFVar3 = Func::GetTopFunc(this->m_func);
            this_02 = Func::GetJITFunctionBody(pFVar3);
            bVar1 = JITTimeFunctionBody::IsCoroutine(this_02);
            if ((!bVar1) || (bVar1 = Func::IsLoopBody(this->m_func), bVar1)) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
IRBuilder::DoBailOnNoProfile()
{
    if (PHASE_OFF(Js::BailOnNoProfilePhase, this->m_func->GetTopFunc()))
    {
        return false;
    }

    Func *const topFunc = m_func->GetTopFunc();
    if(topFunc->GetWorkItem()->GetProfiledIterations() == 0)
    {
        // The top function has not been profiled yet. Some switch must have been used to force jitting. This is not a
        // real-world case, but for the purpose of testing the JIT, it's beneficial to generate code in unprofiled paths.
        return false;
    }

    if (m_func->HasProfileInfo() && m_func->GetReadOnlyProfileInfo()->IsNoProfileBailoutsDisabled())
    {
        return false;
    }

    if (!m_func->DoGlobOpt())
    {
        return false;
    }

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (this->m_func->GetTopFunc() != this->m_func && Js::Configuration::Global.flags.IsEnabled(Js::ForceJITLoopBodyFlag))
    {
        // No profile data for loop bodies with -force...
        return false;
    }
#endif

    if (!this->m_func->HasProfileInfo())
    {
        return false;
    }

    if (m_func->GetTopFunc()->GetJITFunctionBody()->IsCoroutine() && !m_func->IsLoopBody())
    {
        return false;
    }

    return true;
}